

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

size_t __thiscall HFSubConsumer::available(HFSubConsumer *this,long timeout)

{
  __int_type _Var1;
  __int_type _Var2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  size_t sVar4;
  __pointer_type pPVar5;
  long lVar6;
  int i;
  int iVar7;
  timespec t;
  timespec local_38;
  
  pPVar5 = (this->framequeue).producerListTail._M_b._M_p;
  if (pPVar5 == (__pointer_type)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    do {
      _Var1 = (pPVar5->tailIndex).super___atomic_base<unsigned_long>._M_i;
      _Var2 = (pPVar5->headIndex).super___atomic_base<unsigned_long>._M_i;
      lVar6 = _Var1 - _Var2;
      if (_Var2 - _Var1 < 0x8000000000000001) {
        lVar6 = 0;
      }
      sVar4 = sVar4 + lVar6;
      pCVar3 = (pPVar5->super_ConcurrentQueueProducerTypelessBase).next;
      pPVar5 = (__pointer_type)&pCVar3[-1].token;
    } while (pCVar3 != (ConcurrentQueueProducerTypelessBase *)0x0);
  }
  if ((timeout != 0) && (sVar4 == 0)) {
    if (timeout == 1) {
      local_38.tv_sec = 0;
      local_38.tv_nsec = 0x30958;
      iVar7 = 0;
      do {
        clock_nanosleep(1,1,&local_38,(timespec *)0x0);
        pPVar5 = (this->framequeue).producerListTail._M_b._M_p;
        if (pPVar5 != (__pointer_type)0x0) {
          sVar4 = 0;
          do {
            _Var1 = (pPVar5->tailIndex).super___atomic_base<unsigned_long>._M_i;
            _Var2 = (pPVar5->headIndex).super___atomic_base<unsigned_long>._M_i;
            lVar6 = _Var1 - _Var2;
            if (_Var2 - _Var1 < 0x8000000000000001) {
              lVar6 = 0;
            }
            sVar4 = sVar4 + lVar6;
            pCVar3 = (pPVar5->super_ConcurrentQueueProducerTypelessBase).next;
            pPVar5 = (__pointer_type)&pCVar3[-1].token;
          } while (pCVar3 != (ConcurrentQueueProducerTypelessBase *)0x0);
          if (sVar4 != 0) {
            return sVar4;
          }
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != 5);
    }
    else {
      zmq_poll(this->pollitem,1,0);
      if ((this->pollitem->revents & 1) != 0) {
        zsock_brecv(this->req,"8",&local_38);
      }
      zstr_send(this->req,"$WT");
      zmq_poll(this->pollitem,1,timeout);
      if ((this->pollitem->revents & 1) != 0) {
        zsock_brecv(this->req,"8",&local_38);
        return local_38.tv_sec;
      }
    }
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

size_t HFSubConsumer::available(long timeout){
    /* attempts at optimization:
     * 1. if timeout is 0ms, don't even send out polling request
     * 2. if timeout is 1ms, don't bother sending out polling req, but check queue 4 times
     *      - this way, worst case added latency is ~0.25ms
     * 3. else, clear the req-rep polls, send a wait request to other thread
     */ 
    size_t num = framequeue.size_approx();
    if(num || timeout == 0){
        return num;
    }
#ifdef __linux__
    else if(timeout == 1){
        const struct timespec t = {0, 199*1000};
        for(int i=0; i<5;i++){
            clock_nanosleep(CLOCK_MONOTONIC, TIMER_ABSTIME, &t, NULL);
            if((num=framequeue.size_approx())){
                return num;
            }
        }
    }
#endif
    else{
        uint64_t avail;
        //Polling could have timed out last time. First check if there is a message waiting to be grabbed.
        //If there is, it must be an old value since the framequeue size we got was 0. Toss it and try again.
        zmq_poll(pollitem, 1, 0);
        if(pollitem->revents & ZMQ_POLLIN){
            zsock_brecv(req, "8", &avail);
        }

        //Request again after clearing any messages.
        zstr_send(req, waittimeout);
        zmq_poll(pollitem, 1, timeout);
        if(pollitem->revents & ZMQ_POLLIN){
            zsock_brecv(req, "8", &avail);
            return avail;
        }
    }